

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_binsr_w_mipsel(CPUMIPSState_conflict4 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int64_t iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  uVar3 = (ulong)wd;
  lVar4 = uVar3 * 0x10;
  lVar5 = (ulong)ws * 0x10;
  lVar2 = (ulong)wt * 0x10;
  iVar1 = msa_binsr_df(2,(long)(int)(env->active_fpu).fpr[uVar3].fs[0],
                       (long)(int)(env->active_fpu).fpr[ws].fs[0],
                       (long)(int)(env->active_fpu).fpr[wt].fs[0]);
  (env->active_fpu).fpr[uVar3].fs[0] = (float32)iVar1;
  iVar1 = msa_binsr_df(2,(long)*(int *)((long)(env->active_fpu).fpr + lVar4 + 4),
                       (long)*(int *)((long)(env->active_fpu).fpr + lVar5 + 4),
                       (long)*(int *)((long)(env->active_fpu).fpr + lVar2 + 4));
  *(int *)((long)(env->active_fpu).fpr + lVar4 + 4) = (int)iVar1;
  iVar1 = msa_binsr_df(2,(long)*(int *)((long)(env->active_fpu).fpr + lVar4 + 8),
                       (long)*(int *)((long)(env->active_fpu).fpr + lVar5 + 8),
                       (long)*(int *)((long)(env->active_fpu).fpr + lVar2 + 8));
  *(int *)((long)(env->active_fpu).fpr + lVar4 + 8) = (int)iVar1;
  iVar1 = msa_binsr_df(2,(long)*(int *)((long)(env->active_fpu).fpr + lVar4 + 0xc),
                       (long)*(int *)((long)(env->active_fpu).fpr + lVar5 + 0xc),
                       (long)*(int *)((long)(env->active_fpu).fpr + lVar2 + 0xc));
  *(int *)((long)(env->active_fpu).fpr + lVar4 + 0xc) = (int)iVar1;
  return;
}

Assistant:

void helper_msa_binsr_w(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_binsr_df(DF_WORD, pwd->w[0],  pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_binsr_df(DF_WORD, pwd->w[1],  pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_binsr_df(DF_WORD, pwd->w[2],  pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_binsr_df(DF_WORD, pwd->w[3],  pws->w[3],  pwt->w[3]);
}